

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O1

optional<tinyusdz::ListOp<tinyusdz::Path>_> * __thiscall
tinyusdz::crate::CrateValue::get_value<tinyusdz::ListOp<tinyusdz::Path>>
          (optional<tinyusdz::ListOp<tinyusdz::Path>_> *__return_storage_ptr__,CrateValue *this)

{
  undefined1 local_b0 [8];
  value_type local_a8;
  
  tinyusdz::value::Value::get_value<tinyusdz::ListOp<tinyusdz::Path>>
            ((optional<tinyusdz::ListOp<tinyusdz::Path>_> *)local_b0,&this->value_,false);
  __return_storage_ptr__->has_value_ = local_b0[0];
  if (local_b0[0] == true) {
    nonstd::optional_lite::detail::storage_t<tinyusdz::ListOp<tinyusdz::Path>_>::construct_value
              (&__return_storage_ptr__->contained,(value_type *)(local_b0 + 8));
  }
  if (local_b0[0] == true) {
    nonstd::optional_lite::detail::storage_t<tinyusdz::ListOp<tinyusdz::Path>_>::destruct_value
              ((storage_t<tinyusdz::ListOp<tinyusdz::Path>_> *)(local_b0 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }